

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cereal.hpp
# Opt level: O0

uint32_t __thiscall
cereal::InputArchive<cereal::BinaryInputArchive,_1U>::
loadClassVersion<eos::morphablemodel::MorphableModel>
          (InputArchive<cereal::BinaryInputArchive,_1U> *this)

{
  bool bVar1;
  int iVar2;
  pointer ppVar3;
  type head;
  const_iterator local_40;
  uint32_t local_34;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false> _Stack_30;
  uint32_t version;
  _Node_iterator_base<std::pair<const_unsigned_long,_unsigned_int>,_false> local_28;
  iterator lookupResult;
  InputArchive<cereal::BinaryInputArchive,_1U> *this_local;
  
  if (InputArchive<cereal::BinaryInputArchive,1u>::
      loadClassVersion<eos::morphablemodel::MorphableModel>()::hash == '\0') {
    iVar2 = __cxa_guard_acquire(&InputArchive<cereal::BinaryInputArchive,1u>::
                                 loadClassVersion<eos::morphablemodel::MorphableModel>()::hash);
    if (iVar2 != 0) {
      std::type_index::type_index
                ((type_index *)&lookupResult,
                 (type_info *)&eos::morphablemodel::MorphableModel::typeinfo);
      loadClassVersion<eos::morphablemodel::MorphableModel>::hash =
           std::type_index::hash_code((type_index *)&lookupResult);
      __cxa_guard_release(&InputArchive<cereal::BinaryInputArchive,1u>::
                           loadClassVersion<eos::morphablemodel::MorphableModel>()::hash);
    }
  }
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
       ::find(&this->itsVersionedTypes,&loadClassVersion<eos::morphablemodel::MorphableModel>::hash)
  ;
  _Stack_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
       ::end(&this->itsVersionedTypes);
  bVar1 = std::__detail::operator!=(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    ppVar3 = std::__detail::
             _Node_iterator<std::pair<const_unsigned_long,_unsigned_int>,_false,_false>::operator->
                       ((_Node_iterator<std::pair<const_unsigned_long,_unsigned_int>,_false,_false>
                         *)&local_28);
    this_local._4_4_ = ppVar3->second;
  }
  else {
    head = make_nvp<cereal::BinaryInputArchive,unsigned_int&>("cereal_class_version",&local_34);
    InputArchive<cereal::BinaryInputArchive,1u>::process<unsigned_int&>
              ((InputArchive<cereal::BinaryInputArchive,1u> *)this,head);
    std::__detail::_Node_const_iterator<std::pair<const_unsigned_long,_unsigned_int>,_false,_false>
    ::_Node_const_iterator
              (&local_40,
               (_Node_iterator<std::pair<const_unsigned_long,_unsigned_int>,_false,_false> *)
               &local_28);
    std::
    unordered_map<unsigned_long,unsigned_int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
    ::emplace_hint<unsigned_long_const&,unsigned_int&>
              ((unordered_map<unsigned_long,unsigned_int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_int>>>
                *)&this->itsVersionedTypes,local_40,
               &loadClassVersion<eos::morphablemodel::MorphableModel>::hash,&local_34);
    this_local._4_4_ = local_34;
  }
  return this_local._4_4_;
}

Assistant:

inline
      std::uint32_t loadClassVersion()
      {
        static const auto hash = std::type_index(typeid(T)).hash_code();
        auto lookupResult = itsVersionedTypes.find( hash );

        if( lookupResult != itsVersionedTypes.end() ) // already exists
          return lookupResult->second;
        else // need to load
        {
          std::uint32_t version;

          process( make_nvp<ArchiveType>("cereal_class_version", version) );
          itsVersionedTypes.emplace_hint( lookupResult, hash, version );

          return version;
        }
      }